

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O2

__pid_t __thiscall acto::core::event::wait(event *this,void *__stat_loc)

{
  unique_lock<std::mutex> g;
  
  std::unique_lock<std::mutex>::unique_lock(&g,&this->mutex_);
  while (this->triggered_ == false) {
    std::condition_variable::wait((unique_lock *)&this->cond_);
  }
  this->triggered_ = (bool)(this->auto_ ^ 1);
  std::unique_lock<std::mutex>::~unique_lock(&g);
  return 1;
}

Assistant:

wait_result event::wait() {
  std::unique_lock g(mutex_);

  cond_.wait(g, [this] { return triggered_; });

  triggered_ = !auto_;

  return wait_result::signaled;
}